

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

VariableIndex __thiscall
cnn::ComputationGraph::add_const_lookup
          (ComputationGraph *this,LookupParameters *p,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  size_type sVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices_00;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *in_RSI;
  VariableIndex *in_RDI;
  LookupNode *new_node;
  VariableIndex *new_node_index;
  uint uVar2;
  VariableIndex *__x;
  LookupParameters *in_stack_ffffffffffffffb8;
  LookupNode *in_stack_ffffffffffffffc0;
  uint local_24 [9];
  
  __x = in_RDI;
  sVar1 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size(in_RSI);
  local_24[0] = (uint)sVar1;
  VariableIndex::VariableIndex(in_RDI,local_24);
  indices_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0xa8);
  LookupNode::LookupNode(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,indices_00);
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::push_back(in_RSI,(value_type *)__x);
  uVar2 = (uint)__x;
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)indices);
  return (VariableIndex)uVar2;
}

Assistant:

VariableIndex ComputationGraph::add_const_lookup(LookupParameters* p, const std::vector<unsigned>& indices) {
  VariableIndex new_node_index(nodes.size());
  LookupNode* new_node = new LookupNode(p, indices);
  nodes.push_back(new_node);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}